

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_range(Curl_easy *data,Curl_HttpReq httpreq)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  char *format;
  
  if (((data->state).field_0x6d1 & 2) == 0) {
    return CURLE_OK;
  }
  switch(httpreq) {
  case HTTPREQ_GET:
  case HTTPREQ_HEAD:
    break;
  case HTTPREQ_POST:
  case HTTPREQ_PUT:
    goto switchD_0013ad27_caseD_1;
  default:
    return CURLE_OK;
  }
  pcVar2 = Curl_checkheaders(data,"Range",5);
  if (pcVar2 == (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.rangeline);
    pcVar2 = curl_maprintf("Range: bytes=%s\r\n",(data->state).range);
    (data->state).aptr.rangeline = pcVar2;
    return CURLE_OK;
  }
  if ((httpreq != HTTPREQ_PUT) && (httpreq != HTTPREQ_POST)) {
    return CURLE_OK;
  }
switchD_0013ad27_caseD_1:
  pcVar2 = Curl_checkheaders(data,"Content-Range",0xd);
  if (pcVar2 != (char *)0x0) {
    return CURLE_OK;
  }
  (*Curl_cfree)((data->state).aptr.rangeline);
  if ((data->set).set_resume_from < 0) {
    lVar3 = (data->state).infilesize;
    pcVar2 = (char *)(lVar3 + -1);
    format = "Content-Range: bytes 0-%ld/%ld\r\n";
  }
  else {
    lVar3 = (data->state).resume_from;
    if (lVar3 != 0) {
      lVar1 = (data->state).infilesize;
      pcVar2 = curl_maprintf("Content-Range: bytes %s%ld/%ld\r\n",(data->state).range,
                             lVar1 + lVar3 + -1,lVar1 + lVar3);
      goto LAB_0013ae19;
    }
    pcVar2 = (data->state).range;
    lVar3 = (data->state).infilesize;
    format = "Content-Range: bytes %s/%ld\r\n";
  }
  pcVar2 = curl_maprintf(format,pcVar2,lVar3);
LAB_0013ae19:
  (data->state).aptr.rangeline = pcVar2;
  if (pcVar2 != (char *)0x0) {
    return CURLE_OK;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_http_range(struct Curl_easy *data,
                         Curl_HttpReq httpreq)
{
  if(data->state.use_range) {
    /*
     * A range is selected. We use different headers whether we're downloading
     * or uploading and we always let customized headers override our internal
     * ones if any such are specified.
     */
    if(((httpreq == HTTPREQ_GET) || (httpreq == HTTPREQ_HEAD)) &&
       !Curl_checkheaders(data, STRCONST("Range"))) {
      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);
      data->state.aptr.rangeline = aprintf("Range: bytes=%s\r\n",
                                           data->state.range);
    }
    else if((httpreq == HTTPREQ_POST || httpreq == HTTPREQ_PUT) &&
            !Curl_checkheaders(data, STRCONST("Content-Range"))) {

      /* if a line like this was already allocated, free the previous one */
      free(data->state.aptr.rangeline);

      if(data->set.set_resume_from < 0) {
        /* Upload resume was asked for, but we don't know the size of the
           remote part so we tell the server (and act accordingly) that we
           upload the whole file (again) */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes 0-%" CURL_FORMAT_CURL_OFF_T
                  "/%" CURL_FORMAT_CURL_OFF_T "\r\n",
                  data->state.infilesize - 1, data->state.infilesize);

      }
      else if(data->state.resume_from) {
        /* This is because "resume" was selected */
        curl_off_t total_expected_size =
          data->state.resume_from + data->state.infilesize;
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s%" CURL_FORMAT_CURL_OFF_T
                  "/%" CURL_FORMAT_CURL_OFF_T "\r\n",
                  data->state.range, total_expected_size-1,
                  total_expected_size);
      }
      else {
        /* Range was selected and then we just pass the incoming range and
           append total size */
        data->state.aptr.rangeline =
          aprintf("Content-Range: bytes %s/%" CURL_FORMAT_CURL_OFF_T "\r\n",
                  data->state.range, data->state.infilesize);
      }
      if(!data->state.aptr.rangeline)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}